

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O3

void __thiscall
Args::HelpPrinter::printOnlyFor
          (HelpPrinter *this,ArgIface *arg,OutStreamType *to,size_type beforeDescription,
          size_type param_4)

{
  char *pcVar1;
  long lVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pbVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  OutStreamType *pOVar6;
  pointer word;
  anon_class_16_2_51562d2c __f;
  bool makeOffset;
  size_type maxLineLength;
  size_type length;
  char local_b9;
  undefined1 local_b8 [32];
  size_type *local_98;
  ulong *local_90;
  HelpPrinter *local_88;
  size_type *local_80;
  ulong local_78;
  size_type local_70;
  OutStreamType *local_68;
  OutStreamType *local_60;
  StringList local_58;
  size_type local_38;
  
  iVar4 = (*arg->_vptr_ArgIface[7])(arg);
  pcVar1 = local_b8 + 0x10;
  if (*(long *)(CONCAT44(extraout_var,iVar4) + 8) == 0) {
    local_b8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct((ulong)local_b8,'\x04');
    std::__ostream_insert<char,std::char_traits<char>>(to,(char *)local_b8._0_8_,local_b8._8_8_);
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    pOVar6 = (OutStreamType *)0x4;
  }
  else {
    local_b8[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(to,local_b8,1);
    local_b8[0] = 0x2d;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(to,local_b8,1);
    iVar4 = (*arg->_vptr_ArgIface[7])(arg);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,*(char **)CONCAT44(extraout_var_00,iVar4),
               ((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1]);
    iVar4 = (*arg->_vptr_ArgIface[7])(arg);
    lVar2 = *(long *)(CONCAT44(extraout_var_01,iVar4) + 8);
    iVar4 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_02,iVar4) + 8) == 0) {
      iVar4 = (*arg->_vptr_ArgIface[4])(arg);
      if ((char)iVar4 == '\0') {
        pOVar6 = (OutStreamType *)(lVar2 + 2);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(to," <",2);
        iVar4 = (*arg->_vptr_ArgIface[9])(arg);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (to,*(char **)CONCAT44(extraout_var_03,iVar4),
                            ((undefined8 *)CONCAT44(extraout_var_03,iVar4))[1]);
        local_b8[0] = 0x3e;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b8,1);
        iVar4 = (*arg->_vptr_ArgIface[9])(arg);
        pOVar6 = (OutStreamType *)(lVar2 + *(long *)(CONCAT44(extraout_var_04,iVar4) + 8) + 5);
      }
    }
    else {
      local_b8[0] = 0x2c;
      std::__ostream_insert<char,std::char_traits<char>>(to,local_b8,1);
      pOVar6 = (OutStreamType *)(lVar2 + 3);
    }
  }
  iVar4 = (*arg->_vptr_ArgIface[8])(arg);
  if (*(long *)(CONCAT44(extraout_var_05,iVar4) + 8) == 0) {
    iVar4 = (*arg->_vptr_ArgIface[7])(arg);
    if (*(long *)(CONCAT44(extraout_var_10,iVar4) + 8) != 0) goto LAB_0010db7f;
    iVar4 = (*arg->_vptr_ArgIface[8])(arg);
    if (*(long *)(CONCAT44(extraout_var_11,iVar4) + 8) != 0) goto LAB_0010db7f;
    local_b8[0] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(to,local_b8,1);
    (*arg->_vptr_ArgIface[3])(local_b8,arg);
    std::__ostream_insert<char,std::char_traits<char>>(to,(char *)local_b8._0_8_,local_b8._8_8_);
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    (*arg->_vptr_ArgIface[3])(local_b8);
    pOVar6 = pOVar6 + 1 + local_b8._8_8_;
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  else {
    local_b8[0] = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(to,local_b8,1);
    std::__ostream_insert<char,std::char_traits<char>>(to,"--",2);
    iVar4 = (*arg->_vptr_ArgIface[8])(arg);
    std::__ostream_insert<char,std::char_traits<char>>
              (to,*(char **)CONCAT44(extraout_var_06,iVar4),
               ((undefined8 *)CONCAT44(extraout_var_06,iVar4))[1]);
    iVar4 = (*arg->_vptr_ArgIface[8])(arg);
    pOVar6 = pOVar6 + *(long *)(CONCAT44(extraout_var_07,iVar4) + 8) + 3;
  }
  iVar4 = (*arg->_vptr_ArgIface[4])(arg);
  if ((char)iVar4 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(to," <",2);
    iVar4 = (*arg->_vptr_ArgIface[9])(arg);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (to,*(char **)CONCAT44(extraout_var_08,iVar4),
                        ((undefined8 *)CONCAT44(extraout_var_08,iVar4))[1]);
    local_b8[0] = 0x3e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_b8,1);
    iVar4 = (*arg->_vptr_ArgIface[9])(arg);
    pOVar6 = pOVar6 + *(long *)(CONCAT44(extraout_var_09,iVar4) + 8) + 3;
  }
LAB_0010db7f:
  iVar4 = (*arg->_vptr_ArgIface[10])(arg);
  local_b8._8_8_ = (OutStreamType *)0x0;
  local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __first._M_current = *(char **)CONCAT44(extraout_var_12,iVar4);
  __f.result = &local_58;
  __f.word = (String *)local_b8;
  local_b8._0_8_ = pcVar1;
  std::
  for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,Args::HelpPrinter::splitToWords(std::__cxx11::string_const&)const::_lambda(char_const&)_1_>
            (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + ((undefined8 *)CONCAT44(extraout_var_12,iVar4))[1]),__f
            );
  if ((OutStreamType *)local_b8._8_8_ != (OutStreamType *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,(value_type *)local_b8);
  }
  if ((char *)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  local_70 = 0;
  local_78 = this->m_lineLength - beforeDescription;
  if (this->m_lineLength < beforeDescription) {
    local_78 = 0;
  }
  local_68 = (OutStreamType *)beforeDescription;
  local_60 = pOVar6;
  if (local_78 < 0x14) {
    std::__ostream_insert<char,std::char_traits<char>>(to,"\n\n",2);
    local_78 = this->m_lineLength - 0x14;
    local_60 = (OutStreamType *)0x0;
    local_68 = (OutStreamType *)0x14;
  }
  pbVar3 = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = 0;
  local_98 = &local_38;
  local_b9 = local_60 < local_68;
  local_b8._0_8_ = &local_b9;
  local_38 = 0;
  local_b8._16_8_ = &local_60;
  local_b8._24_8_ = &local_68;
  local_90 = &local_78;
  local_80 = &local_70;
  local_b8._8_8_ = to;
  local_88 = this;
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    word = local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      printString::anon_class_64_8_a3d8de13::operator()((anon_class_64_8_a3d8de13 *)local_b8,word);
      word = word + 1;
    } while (word != pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(to,"\n",1);
  std::ostream::flush();
  return;
}

Assistant:

inline void
HelpPrinter::printOnlyFor( ArgIface * arg, OutStreamType & to,
	String::size_type beforeDescription, String::size_type ) const
{
	String::size_type pos = 0;

	if( !arg->flag().empty() )
	{
		to << ' ';
		++pos;
		to << '-' << arg->flag();
		pos += arg->flag().length() + 1;

		if( !arg->argumentName().empty() )
		{
			to << ',';
			++pos;
		}
		else if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else
	{
		printOffset( to, pos, 4 );
		pos = 4;
	}

	if( !arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << "--" << arg->argumentName();
		pos += arg->argumentName().length() + 2;

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
	{
		to << ' ';
		++pos;
		to << arg->name();
		pos += arg->name().length();

		if( arg->isWithValue() )
		{
			to << " <" << arg->valueSpecifier() << '>';
			pos += arg->valueSpecifier().length() + 3;
		}
	}

	printString( to, splitToWords( arg->description() ), pos,
		beforeDescription, 0 );

	to << "\n" << "\n";

	to.flush();
}